

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeClose(Btree *p)

{
  int *piVar1;
  int iVar2;
  BtShared *p_00;
  Btree *pBVar3;
  Btree *pBVar4;
  bool bVar5;
  BtShared *pBVar6;
  int extraout_EAX;
  sqlite3_mutex *psVar7;
  BtShared **ppBVar8;
  BtShared *pBVar9;
  u8 *p_01;
  
  p_00 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  sqlite3BtreeRollback(p,0,0);
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      if (p->sharable == '\0') goto LAB_0013f459;
    }
    bVar5 = true;
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_0013f3ef:
      psVar7 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar7 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      if (psVar7 == (sqlite3_mutex *)0x0) goto LAB_0013f3ef;
      (*sqlite3Config.mutex.xMutexEnter)(psVar7);
      bVar5 = false;
    }
    iVar2 = p_00->nRef;
    p_00->nRef = iVar2 + -1;
    if (iVar2 < 2) {
      pBVar6 = sqlite3SharedCacheList;
      if (sqlite3SharedCacheList == p_00) {
        ppBVar8 = &sqlite3SharedCacheList;
      }
      else {
        do {
          pBVar9 = pBVar6;
          if (pBVar9 == (BtShared *)0x0) goto LAB_0013f436;
          pBVar6 = pBVar9->pNext;
        } while (pBVar9->pNext != p_00);
        ppBVar8 = &pBVar9->pNext;
      }
      *ppBVar8 = p_00->pNext;
LAB_0013f436:
      if (p_00->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(p_00->mutex);
      }
    }
    if (!bVar5) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar7);
    }
    if (1 < iVar2) goto LAB_0013f4b5;
  }
LAB_0013f459:
  sqlite3PagerClose(p_00->pPager,p->db);
  if ((p_00->xFreeSchema != (_func_void_void_ptr *)0x0) && (p_00->pSchema != (void *)0x0)) {
    (*p_00->xFreeSchema)(p_00->pSchema);
  }
  if (p_00->pSchema != (void *)0x0) {
    sqlite3_free(p_00->pSchema);
  }
  if (p_00->pTmpSpace != (u8 *)0x0) {
    p_01 = p_00->pTmpSpace + -4;
    p_00->pTmpSpace = p_01;
    pcache1Free(p_01);
    p_00->pTmpSpace = (u8 *)0x0;
  }
  sqlite3_free(p_00);
LAB_0013f4b5:
  pBVar3 = p->pNext;
  pBVar4 = p->pPrev;
  if (pBVar4 != (Btree *)0x0) {
    pBVar4->pNext = pBVar3;
  }
  if (pBVar3 != (Btree *)0x0) {
    pBVar3->pPrev = pBVar4;
  }
  sqlite3_free(p);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClose(Btree *p){
  BtShared *pBt = p->pBt;

  /* Close all cursors opened via this handle.  */
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);

  /* Verify that no other cursors have this Btree open */
#ifdef SQLITE_DEBUG
  {
    BtCursor *pCur = pBt->pCursor;
    while( pCur ){
      BtCursor *pTmp = pCur;
      pCur = pCur->pNext;
      assert( pTmp->pBtree!=p );

    }
  }
#endif

  /* Rollback any active transaction and free the handle structure.
  ** The call to sqlite3BtreeRollback() drops any table-locks held by
  ** this handle.
  */
  sqlite3BtreeRollback(p, SQLITE_OK, 0);
  sqlite3BtreeLeave(p);

  /* If there are still other outstanding references to the shared-btree
  ** structure, return now. The remainder of this procedure cleans
  ** up the shared-btree.
  */
  assert( p->wantToLock==0 && p->locked==0 );
  if( !p->sharable || removeFromSharingList(pBt) ){
    /* The pBt is no longer on the sharing list, so we can access
    ** it without having to hold the mutex.
    **
    ** Clean out and delete the BtShared object.
    */
    assert( !pBt->pCursor );
    sqlite3PagerClose(pBt->pPager, p->db);
    if( pBt->xFreeSchema && pBt->pSchema ){
      pBt->xFreeSchema(pBt->pSchema);
    }
    sqlite3DbFree(0, pBt->pSchema);
    freeTempSpace(pBt);
    sqlite3_free(pBt);
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  assert( p->wantToLock==0 );
  assert( p->locked==0 );
  if( p->pPrev ) p->pPrev->pNext = p->pNext;
  if( p->pNext ) p->pNext->pPrev = p->pPrev;
#endif

  sqlite3_free(p);
  return SQLITE_OK;
}